

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_begin_titled(nk_context *ctx,char *name,char *title,nk_rect bounds,nk_flags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  nk_user_font *pnVar14;
  nk_window *pnVar15;
  int iVar16;
  nk_hash hash;
  nk_window *win;
  nk_window *pnVar17;
  nk_panel *pnVar18;
  uint uVar19;
  nk_window *pnVar20;
  uint uVar21;
  nk_size nVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined8 uVar27;
  nk_rect b;
  nk_rect rect;
  float local_78;
  float fStack_74;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4344,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4345,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4346,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  pnVar14 = (ctx->style).font;
  if ((pnVar14 == (nk_user_font *)0x0) || (pnVar14->width == (nk_text_width_f)0x0)) {
    __assert_fail("ctx->style.font && ctx->style.font->width && \"if this triggers you forgot to add a font\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4347,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    __assert_fail("!ctx->current && \"if this triggers you missed a `nk_end` call\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4348,
                  "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                 );
  }
  iVar16 = nk_strlen(name);
  hash = nk_murmur_hash(name,iVar16,0x40);
  win = nk_find_window(ctx,hash,name);
  local_78 = bounds.x;
  fStack_74 = bounds.y;
  if (win == (nk_window *)0x0) {
    uVar21 = nk_strlen(name);
    win = (nk_window *)nk_create_window(ctx);
    nk_insert_window(ctx,win,flags >> 8 & NK_INSERT_FRONT);
    (win->buffer).base = &ctx->memory;
    (win->buffer).use_clipping = 1;
    nVar22 = (ctx->memory).allocated;
    (win->buffer).begin = nVar22;
    (win->buffer).end = nVar22;
    (win->buffer).last = nVar22;
    win->flags = flags;
    (win->bounds).x = (float)(int)bounds._0_8_;
    (win->bounds).y = (float)(int)((ulong)bounds._0_8_ >> 0x20);
    (win->bounds).w = (float)(int)bounds._8_8_;
    (win->bounds).h = (float)(int)((ulong)bounds._8_8_ >> 0x20);
    win->name = hash;
    nVar22 = 0x3f;
    if (uVar21 < 0x3f) {
      nVar22 = (nk_size)uVar21;
    }
    nk_memcopy(win->name_string,name,nVar22);
    win->name_string[nVar22] = '\0';
    (win->popup).win = (nk_window *)0x0;
  }
  else {
    win->flags = win->flags & 0xfffffc00 | flags;
    if ((flags & 6) == 0) {
      (win->bounds).x = local_78;
      (win->bounds).y = fStack_74;
      (win->bounds).w = bounds.w;
      (win->bounds).h = bounds.h;
    }
    if (win->seq == ctx->seq) {
      __assert_fail("win->seq != ctx->seq",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x4373,
                    "int nk_begin_titled(struct nk_context *, const char *, const char *, struct nk_rect, nk_flags)"
                   );
    }
    win->seq = ctx->seq;
  }
  if (ctx->active == (nk_window *)0x0) {
    ctx->active = win;
  }
  uVar21 = win->flags;
  if ((uVar21 >> 0xc & 1) != 0) {
    ctx->current = win;
    return 0;
  }
  fVar25 = (ctx->style).window.header.padding.y;
  fVar3 = (ctx->style).window.header.label_padding.y;
  fVar25 = fVar3 + fVar3 + fVar25 + fVar25 + ((ctx->style).font)->height;
  if ((uVar21 >> 0xe & 1) == 0) {
    fVar2 = (win->bounds).x;
    fVar8 = (win->bounds).y;
    fVar3 = (win->bounds).w;
    uVar9 = (win->bounds).h;
    fVar24 = (float)uVar9;
  }
  else {
    uVar4 = (win->bounds).x;
    uVar10 = (win->bounds).y;
    fVar3 = (win->bounds).w;
    fVar2 = (float)uVar4;
    fVar8 = (float)uVar10;
    fVar24 = fVar25;
  }
  nVar22 = (ctx->memory).allocated;
  (win->buffer).begin = nVar22;
  (win->buffer).end = nVar22;
  (win->buffer).last = nVar22;
  (win->buffer).clip = nk_null_rect;
  bVar23 = false;
  rect.y = fVar8;
  rect.x = fVar2;
  rect.h = fVar24;
  rect.w = fVar3;
  b.y = fVar8;
  b.x = fVar2;
  b.h = fVar24;
  b.w = fVar3;
  iVar16 = nk_input_has_mouse_click_down_in_rect(&ctx->input,NK_BUTTON_LEFT,b,1);
  if (iVar16 != 0) {
    bVar23 = (ctx->input).mouse.buttons[0].clicked != 0;
  }
  iVar16 = nk_input_is_mouse_hovering_rect(&ctx->input,rect);
  uVar19 = uVar21;
  if (((win != ctx->active) && (iVar16 != 0)) && ((ctx->input).mouse.buttons[0].down == 0)) {
    pnVar17 = win;
    do {
      pnVar17 = pnVar17->next;
      if (pnVar17 == (nk_window *)0x0) {
        pnVar17 = ctx->end;
        goto LAB_0012619c;
      }
      uVar19 = pnVar17->flags;
      if ((uVar19 >> 0xe & 1) == 0) {
        uVar27._0_4_ = (pnVar17->bounds).w;
        uVar27._4_4_ = (pnVar17->bounds).h;
      }
      else {
        uVar27 = CONCAT44(fVar25,(pnVar17->bounds).w);
      }
      uVar7 = (pnVar17->bounds).x;
      uVar13 = (pnVar17->bounds).y;
    } while ((((fVar3 + fVar2 < (float)uVar7) || ((float)uVar27 + (float)uVar7 < fVar2)) ||
             (((~uVar19 & 0x1100) == 0 ||
              ((fVar24 + fVar8 < (float)uVar13 ||
               ((float)((ulong)uVar27 >> 0x20) + (float)uVar13 < fVar8)))))) &&
            ((pnVar20 = (pnVar17->popup).win, pnVar20 == (nk_window *)0x0 ||
             ((((((uVar19 >> 0xc & 1) != 0 || ((pnVar17->popup).active == 0)) ||
                (fVar5 = (pnVar20->bounds).x, fVar3 + fVar2 < fVar5)) ||
               ((fVar5 + (pnVar20->bounds).w < fVar2 ||
                (fVar5 = (pnVar20->bounds).y, fVar24 + fVar8 < fVar5)))) ||
              (fVar5 + (pnVar20->bounds).h < fVar8))))));
  }
  if (((bVar23) && (pnVar17 = ctx->end, win != pnVar17)) && ((uVar19 & 0x100) == 0)) {
    pnVar20 = win;
    do {
      pnVar20 = pnVar20->next;
      if (pnVar20 == (nk_window *)0x0) goto LAB_0012619c;
      uVar19 = pnVar20->flags;
      if ((uVar19 >> 0xe & 1) == 0) {
        fVar5 = (pnVar20->bounds).w;
        uVar11 = (pnVar20->bounds).h;
        fVar26 = (float)uVar11;
      }
      else {
        fVar5 = (pnVar20->bounds).w;
        fVar26 = fVar25;
      }
      uVar6 = (pnVar20->bounds).x;
      uVar12 = (pnVar20->bounds).y;
      fVar1 = (ctx->input).mouse.pos.x;
      if ((((float)uVar6 <= fVar1) && (fVar1 <= fVar5 + (float)uVar6)) && ((uVar19 >> 0xc & 1) == 0)
         ) {
        fVar5 = (ctx->input).mouse.pos.y;
        if (((float)uVar12 <= fVar5) && (fVar5 <= fVar26 + (float)uVar12)) break;
      }
      pnVar15 = (pnVar20->popup).win;
    } while ((((pnVar15 == (nk_window *)0x0) ||
              (((uVar19 >> 0xc & 1) != 0 || ((pnVar20->popup).active == 0)))) ||
             (fVar5 = (pnVar15->bounds).x, fVar3 + fVar2 < fVar5)) ||
            (((fVar5 + (pnVar15->bounds).w < fVar2 ||
              (fVar5 = (pnVar15->bounds).y, fVar24 + fVar8 < fVar5)) ||
             (fVar5 + (pnVar15->bounds).h < fVar8))));
  }
LAB_001261d4:
  if ((ctx->end != win) && ((uVar21 & 0x100) == 0)) {
    win->flags = uVar21 | 0x800;
  }
  pnVar18 = (nk_panel *)nk_create_panel(ctx);
  win->layout = pnVar18;
  ctx->current = win;
  iVar16 = nk_panel_begin(ctx,title,NK_PANEL_WINDOW);
  pnVar18 = win->layout;
  pnVar18->offset_x = &(win->scrollbar).x;
  pnVar18->offset_y = &(win->scrollbar).y;
  return iVar16;
LAB_0012619c:
  if (pnVar17 != win) {
    if ((uVar21 >> 8 & 1) == 0) {
      nk_remove_window(ctx,win);
      nk_insert_window(ctx,win,NK_INSERT_BACK);
      uVar21 = win->flags;
    }
    uVar21 = uVar21 & 0xfffff7ff;
    win->flags = uVar21;
    ctx->active = win;
  }
  goto LAB_001261d4;
}

Assistant:

NK_API int
nk_begin_titled(struct nk_context *ctx, const char *name, const char *title,
    struct nk_rect bounds, nk_flags flags)
{
    struct nk_window *win;
    struct nk_style *style;
    nk_hash title_hash;
    int title_len;
    int ret = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(name);
    NK_ASSERT(title);
    NK_ASSERT(ctx->style.font && ctx->style.font->width && "if this triggers you forgot to add a font");
    NK_ASSERT(!ctx->current && "if this triggers you missed a `nk_end` call");
    if (!ctx || ctx->current || !title || !name)
        return 0;

    /* find or create window */
    style = &ctx->style;
    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) {
        /* create new window */
        nk_size name_length = (nk_size)nk_strlen(name);
        win = (struct nk_window*)nk_create_window(ctx);
        NK_ASSERT(win);
        if (!win) return 0;

        if (flags & NK_WINDOW_BACKGROUND)
            nk_insert_window(ctx, win, NK_INSERT_FRONT);
        else nk_insert_window(ctx, win, NK_INSERT_BACK);
        nk_command_buffer_init(&win->buffer, &ctx->memory, NK_CLIPPING_ON);

        win->flags = flags;
        win->bounds = bounds;
        win->name = title_hash;
        name_length = NK_MIN(name_length, NK_WINDOW_MAX_NAME-1);
        NK_MEMCPY(win->name_string, name, name_length);
        win->name_string[name_length] = 0;
        win->popup.win = 0;
        if (!ctx->active)
            ctx->active = win;
    } else {
        /* update window */
        win->flags &= ~(nk_flags)(NK_WINDOW_PRIVATE-1);
        win->flags |= flags;
        if (!(win->flags & (NK_WINDOW_MOVABLE | NK_WINDOW_SCALABLE)))
            win->bounds = bounds;
        /* If this assert triggers you either:
         *
         * I.) Have more than one window with the same name or
         * II.) You forgot to actually draw the window.
         *      More specific you did not call `nk_clear` (nk_clear will be
         *      automatically called for you if you are using one of the
         *      provided demo backends). */
        NK_ASSERT(win->seq != ctx->seq);
        win->seq = ctx->seq;
        if (!ctx->active)
            ctx->active = win;
    }
    if (win->flags & NK_WINDOW_HIDDEN) {
        ctx->current = win;
        return 0;
    }

    /* window overlapping */
    if (!(win->flags & NK_WINDOW_HIDDEN))
    {
        int inpanel, ishovered;
        const struct nk_window *iter = win;
        float h = ctx->style.font->height + 2.0f * style->window.header.padding.y +
            (2.0f * style->window.header.label_padding.y);
        struct nk_rect win_bounds = (!(win->flags & NK_WINDOW_MINIMIZED))?
            win->bounds: nk_rect(win->bounds.x, win->bounds.y, win->bounds.w, h);

        /* activate window if hovered and no other window is overlapping this window */
        nk_start(ctx, win);
        inpanel = nk_input_has_mouse_click_down_in_rect(&ctx->input, NK_BUTTON_LEFT, win_bounds, nk_true);
        inpanel = inpanel && ctx->input.mouse.buttons[NK_BUTTON_LEFT].clicked;
        ishovered = nk_input_is_mouse_hovering_rect(&ctx->input, win_bounds);
        if ((win != ctx->active) && ishovered && !ctx->input.mouse.buttons[NK_BUTTON_LEFT].down) {
            iter = win->next;
            while (iter) {
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                    iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    (!(iter->flags & NK_WINDOW_HIDDEN) || !(iter->flags & NK_WINDOW_BACKGROUND)))
                    break;

                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win->bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }

        /* activate window if clicked */
        if (iter && inpanel && (win != ctx->end) && !(iter->flags & NK_WINDOW_BACKGROUND)) {
            iter = win->next;
            while (iter) {
                /* try to find a panel with higher priority in the same position */
                struct nk_rect iter_bounds = (!(iter->flags & NK_WINDOW_MINIMIZED))?
                iter->bounds: nk_rect(iter->bounds.x, iter->bounds.y, iter->bounds.w, h);
                if (NK_INBOX(ctx->input.mouse.pos.x, ctx->input.mouse.pos.y,
                    iter_bounds.x, iter_bounds.y, iter_bounds.w, iter_bounds.h) &&
                    !(iter->flags & NK_WINDOW_HIDDEN))
                    break;
                if (iter->popup.win && iter->popup.active && !(iter->flags & NK_WINDOW_HIDDEN) &&
                    NK_INTERSECT(win_bounds.x, win_bounds.y, win_bounds.w, win_bounds.h,
                    iter->popup.win->bounds.x, iter->popup.win->bounds.y,
                    iter->popup.win->bounds.w, iter->popup.win->bounds.h))
                    break;
                iter = iter->next;
            }
        }

        if (!iter && ctx->end != win) {
            if (!(win->flags & NK_WINDOW_BACKGROUND)) {
                /* current window is active in that position so transfer to top
                 * at the highest priority in stack */
                nk_remove_window(ctx, win);
                nk_insert_window(ctx, win, NK_INSERT_BACK);
            }
            win->flags &= ~(nk_flags)NK_WINDOW_ROM;
            ctx->active = win;
        }
        if (ctx->end != win && !(win->flags & NK_WINDOW_BACKGROUND))
            win->flags |= NK_WINDOW_ROM;
    }

    win->layout = (struct nk_panel*)nk_create_panel(ctx);
    ctx->current = win;
    ret = nk_panel_begin(ctx, title, NK_PANEL_WINDOW);
    win->layout->offset_x = &win->scrollbar.x;
    win->layout->offset_y = &win->scrollbar.y;
    return ret;
}